

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::RequiredError::~RequiredError(RequiredError *this)

{
  RequiredError *this_local;
  
  ~RequiredError(this);
  operator_delete(this);
  return;
}

Assistant:

explicit RequiredError(std::string name) : RequiredError(name + " is required", ExitCodes::RequiredError) {}